

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# certificate_unittest.cc
# Opt level: O0

void __thiscall
CertificateTest_FromPEM_Test::~CertificateTest_FromPEM_Test(CertificateTest_FromPEM_Test *this)

{
  CertificateTest_FromPEM_Test *this_local;
  
  ~CertificateTest_FromPEM_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CertificateTest, FromPEM) {
  std::string diagnostic;
  std::unique_ptr<bssl::Certificate> cert(
      bssl::Certificate::FromPEM("nonsense", &diagnostic));
  EXPECT_FALSE(cert);

  cert = bssl::Certificate::FromPEM(bssl::ReadTestFileToString(
      "testdata/verify_unittest/self-issued.pem"), &diagnostic);
  EXPECT_TRUE(cert);
}